

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm_io.cc
# Opt level: O1

void __thiscall
gimage::PNMImageIO::load
          (PNMImageIO *this,ImageFloat *image,char *name,int ds,long x,long y,long w,long h)

{
  int *piVar1;
  float *pfVar2;
  float ***pppfVar3;
  undefined1 auVar4 [16];
  ImageFloat *pIVar5;
  void *pvVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  long *plVar14;
  IOException *this_00;
  long lVar15;
  long lVar16;
  long *plVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  void *pvVar26;
  uint uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  int iVar32;
  pos_type pVar33;
  undefined1 auStack_3f8 [12];
  uint local_3ec;
  void *local_3e8;
  ImageFloat *local_3e0;
  void *local_3d8;
  long local_3d0;
  void *local_3c8;
  long local_3c0;
  long local_3b8;
  ulong local_3b0;
  long local_3a8;
  long local_3a0;
  ulong local_398;
  void *local_390;
  ulong local_388;
  ulong local_380;
  int subbit;
  long local_370;
  long local_368;
  long lStack_360;
  string s;
  int depth;
  Properties prop;
  long local_2f0;
  __mbstate_t local_2e8;
  long height;
  long width;
  long local_2b8;
  long local_2b0;
  void *local_2a8;
  void *local_2a0;
  long local_298;
  long local_290;
  ulong local_288;
  long local_280;
  long local_278;
  long local_270;
  long maxval;
  float scale;
  ifstream in;
  uint uStack_254;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_248;
  unsigned_short **ppuStack_238;
  unsigned_short **local_230;
  unsigned_short ***pppuStack_228;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_3e0 = image;
  local_3b8 = x;
  local_3a0 = y;
  bVar7 = gutil::isMSBFirst();
  local_3a8 = CONCAT71(local_3a8._1_7_,bVar7);
  iVar8 = (*(this->super_BasicImageIO)._vptr_BasicImageIO[3])(this,name,1);
  if ((char)iVar8 == '\0') {
    this_00 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&s,name,(allocator *)&subbit);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&prop,
                   "Can only load PNM image (",&s);
    plVar14 = (long *)std::__cxx11::string::append((char *)&prop);
    _in = (pointer)*plVar14;
    paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_in == paVar18) {
      aStack_248._M_allocated_capacity = paVar18->_M_allocated_capacity;
      aStack_248._8_8_ = plVar14[3];
      _in = (pointer)&aStack_248;
    }
    else {
      aStack_248._M_allocated_capacity = paVar18->_M_allocated_capacity;
    }
    *plVar14 = (long)paVar18;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    gutil::IOException::IOException(this_00,(string *)&in);
    __cxa_throw(this_00,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  pVar33 = anon_unknown_11::readPNMHeader(name,&depth,&maxval,&scale,&width,&height);
  pIVar5 = local_3e0;
  local_3b0 = CONCAT44(local_3b0._4_4_,scale);
  if ((scale != 0.0) || (NAN(scale))) {
    uVar22 = 1;
    if (1 < ds) {
      uVar22 = (ulong)(uint)ds;
    }
    local_3c0 = w;
    if (w < 0) {
      local_3c0 = (long)(width + uVar22 + -1) / (long)uVar22;
    }
    if (h < 0) {
      h = (long)(height + uVar22 + -1) / (long)uVar22;
    }
    local_398 = (ulong)depth;
    Image<float,_gimage::PixelTraits<float>_>::setSize(local_3e0,local_3c0,h,local_398);
    auVar4 = _DAT_00163c20;
    lVar19 = pIVar5->n;
    if (lVar19 != 0) {
      lVar21 = -lVar19;
      if (0 < lVar19) {
        lVar21 = lVar19;
      }
      pfVar2 = local_3e0->pixel;
      lVar19 = lVar21 + -1;
      auVar28._8_4_ = (int)lVar19;
      auVar28._0_8_ = lVar19;
      auVar28._12_4_ = (int)((ulong)lVar19 >> 0x20);
      uVar20 = 0;
      auVar28 = auVar28 ^ _DAT_00163c20;
      auVar29 = _DAT_00164060;
      auVar30 = _DAT_00163c10;
      do {
        auVar31 = auVar30 ^ auVar4;
        iVar8 = auVar28._4_4_;
        if ((bool)(~(auVar31._4_4_ == iVar8 && auVar28._0_4_ < auVar31._0_4_ ||
                    iVar8 < auVar31._4_4_) & 1)) {
          pfVar2[uVar20] = INFINITY;
        }
        if ((auVar31._12_4_ != auVar28._12_4_ || auVar31._8_4_ <= auVar28._8_4_) &&
            auVar31._12_4_ <= auVar28._12_4_) {
          pfVar2[uVar20 + 1] = INFINITY;
        }
        auVar31 = auVar29 ^ auVar4;
        iVar32 = auVar31._4_4_;
        if (iVar32 <= iVar8 && (iVar32 != iVar8 || auVar31._0_4_ <= auVar28._0_4_)) {
          pfVar2[uVar20 + 2] = INFINITY;
          pfVar2[uVar20 + 3] = INFINITY;
        }
        uVar20 = uVar20 + 4;
        lVar19 = auVar30._8_8_;
        auVar30._0_8_ = auVar30._0_8_ + 4;
        auVar30._8_8_ = lVar19 + 4;
        lVar19 = auVar29._8_8_;
        auVar29._0_8_ = auVar29._0_8_ + 4;
        auVar29._8_8_ = lVar19 + 4;
      } while ((lVar21 + 3U & 0xfffffffffffffffc) != uVar20);
    }
    std::ifstream::ifstream(&in);
    lVar19 = *(long *)(_in + -0x18);
    *(undefined4 *)((long)&aStack_248 + lVar19 + 0xc) = 7;
    std::ios::clear((int)(auStack_3f8 + lVar19) + 0x1a0);
    std::ifstream::open((char *)&in,(_Ios_Openmode)name);
    local_380 = local_398 & 0xffffffff;
    local_3d0 = width;
    local_3d8 = (void *)height;
    local_2f0 = pVar33._M_off;
    local_2e8 = pVar33._M_state;
    if ((((ds < 2) && (local_3a0 == 0 && local_3b8 == 0)) && (local_3c0 == width)) && (h == height))
    {
      std::istream::seekg(&in,local_2f0,local_2e8);
      if (0 < (long)local_3d8) {
        bVar7 = 0.0 <= (float)local_3b0;
        if ((char)local_3a8 != '\0') {
          bVar7 = (float)local_3b0 <= 0.0;
        }
        local_3a8 = CONCAT44(local_3a8._4_4_,(uint)bVar7);
        local_3b0 = local_398 & 0xffffffff;
        do {
          pvVar26 = local_3d8;
          pvVar6 = (void *)((long)local_3d8 + -1);
          if (0 < local_3d0) {
            lVar19 = 0;
            local_3e8 = local_3d8;
            local_3d8 = (void *)((long)local_3d8 + -1);
            do {
              if (0 < (int)local_380) {
                uVar22 = 0;
                do {
                  if ((char)local_3a8 == '\0') {
                    if (ppuStack_238 < local_230) {
                      uVar27 = (uint)*(byte *)ppuStack_238;
                      ppuStack_238 = (unsigned_short **)((long)ppuStack_238 + 1);
                    }
                    else {
                      uVar27 = (**(code **)(aStack_248._M_allocated_capacity + 0x50))(&aStack_248);
                      pvVar26 = local_3e8;
                    }
                    if (ppuStack_238 < local_230) {
                      uVar10 = (uint)*(byte *)ppuStack_238;
                      ppuStack_238 = (unsigned_short **)((long)ppuStack_238 + 1);
                    }
                    else {
                      uVar10 = (**(code **)(aStack_248._M_allocated_capacity + 0x50))(&aStack_248);
                      pvVar26 = local_3e8;
                    }
                    if (ppuStack_238 < local_230) {
                      uVar11 = (uint)*(byte *)ppuStack_238;
                      ppuStack_238 = (unsigned_short **)((long)ppuStack_238 + 1);
                    }
                    else {
                      uVar11 = (**(code **)(aStack_248._M_allocated_capacity + 0x50))(&aStack_248);
                      pvVar26 = local_3e8;
                    }
                    if (ppuStack_238 < local_230) {
                      uVar9 = (uint)*(byte *)ppuStack_238;
                      ppuStack_238 = (unsigned_short **)((long)ppuStack_238 + 1);
                    }
                    else {
                      uVar9 = (**(code **)(aStack_248._M_allocated_capacity + 0x50))(&aStack_248);
                      pvVar26 = local_3e8;
                    }
                    uVar9 = uVar9 << 0x18;
                    uVar27 = (uVar11 & 0xff) << 0x10 | (uVar10 & 0xff) << 8 | uVar27 & 0xff;
                  }
                  else {
                    if (ppuStack_238 < local_230) {
                      uVar10 = (uint)*(byte *)ppuStack_238;
                      ppuStack_238 = (unsigned_short **)((long)ppuStack_238 + 1);
                    }
                    else {
                      uVar10 = (**(code **)(aStack_248._M_allocated_capacity + 0x50))(&aStack_248);
                      pvVar26 = local_3e8;
                    }
                    if (ppuStack_238 < local_230) {
                      uVar11 = (uint)*(byte *)ppuStack_238;
                      ppuStack_238 = (unsigned_short **)((long)ppuStack_238 + 1);
                    }
                    else {
                      uVar11 = (**(code **)(aStack_248._M_allocated_capacity + 0x50))(&aStack_248);
                      pvVar26 = local_3e8;
                    }
                    if (ppuStack_238 < local_230) {
                      uVar9 = (uint)*(byte *)ppuStack_238;
                      ppuStack_238 = (unsigned_short **)((long)ppuStack_238 + 1);
                    }
                    else {
                      uVar9 = (**(code **)(aStack_248._M_allocated_capacity + 0x50))(&aStack_248);
                      pvVar26 = local_3e8;
                    }
                    if (ppuStack_238 < local_230) {
                      uVar27 = (uint)*(byte *)ppuStack_238;
                      ppuStack_238 = (unsigned_short **)((long)ppuStack_238 + 1);
                    }
                    else {
                      uVar27 = (**(code **)(aStack_248._M_allocated_capacity + 0x50))(&aStack_248);
                      pvVar26 = local_3e8;
                    }
                    uVar9 = (uVar9 & 0xff) << 8 | (uVar11 & 0xff) << 0x10 | uVar10 << 0x18;
                    uVar27 = uVar27 & 0xff;
                  }
                  local_3e0->img[uVar22][(long)local_3d8][lVar19] = (float)(uVar27 | uVar9);
                  uVar22 = uVar22 + 1;
                } while (local_3b0 != uVar22);
              }
              lVar19 = lVar19 + 1;
              pvVar6 = local_3d8;
            } while (lVar19 != local_3d0);
          }
          local_3d8 = pvVar6;
        } while (1 < (long)pvVar26);
      }
    }
    else {
      lVar19 = local_3c0 * local_398;
      uVar20 = lVar19 * 4;
      local_3c8 = operator_new(uVar20);
      if (lVar19 != 0) {
        memset(local_3c8,0,uVar20);
      }
      local_390 = operator_new(uVar20);
      if (lVar19 != 0) {
        memset(local_390,0,uVar20);
      }
      lVar21 = 0;
      if (-local_3a0 != 0 && local_3a0 < 1) {
        lVar21 = -local_3a0;
      }
      if (lVar21 < h) {
        local_298 = 0;
        if (0 < local_3b8) {
          local_298 = local_3b8;
        }
        local_298 = local_298 * uVar22;
        lVar24 = -local_3b8;
        if (-local_3b8 == 0 || 0 < local_3b8) {
          lVar24 = 0;
        }
        lVar25 = local_398 * 4;
        bVar7 = 0.0 <= (float)local_3b0;
        if ((char)local_3a8 != '\0') {
          bVar7 = (float)local_3b0 <= 0.0;
        }
        local_3ec = (uint)bVar7;
        local_2b8 = lVar24 * local_398;
        local_280 = (long)ds;
        local_2a0 = (void *)((long)local_390 + local_2b8 * 4);
        local_2a8 = (void *)((long)local_3c8 + local_2b8 * 4);
        local_3b0 = uVar20;
        local_3a8 = lVar19;
        local_388 = uVar22;
        local_2b0 = h;
        do {
          uVar22 = (lVar21 + local_3a0) * local_388;
          if ((long)local_3d8 <= (long)uVar22) break;
          if (lVar19 != 0) {
            memset(local_3c8,0,uVar20);
            memset(local_390,0,uVar20);
          }
          lVar13 = local_3c0;
          if ((long)uVar22 < (long)local_3d8) {
            local_290 = ~uVar22 + (long)local_3d8;
            uVar23 = 0;
            do {
              local_288 = uVar23;
              std::istream::seekg(&in,((local_290 - uVar23) * local_3d0 + local_298) * lVar25 +
                                      local_2f0,local_2e8);
              if (lVar24 < lVar13) {
                local_3e8 = local_2a0;
                lVar15 = lVar24;
                pvVar26 = local_2a8;
                uVar27 = local_3ec;
                do {
                  local_278 = (local_3b8 + lVar15) * local_388;
                  if (local_3d0 <= local_278) break;
                  lVar13 = 0;
                  do {
                    local_270 = lVar13;
                    if (0 < (int)local_398) {
                      uVar23 = 0;
                      do {
                        if ((char)uVar27 == '\0') {
                          if (ppuStack_238 < local_230) {
                            uVar10 = (uint)*(byte *)ppuStack_238;
                            ppuStack_238 = (unsigned_short **)((long)ppuStack_238 + 1);
                          }
                          else {
                            uVar10 = (**(code **)(aStack_248._M_allocated_capacity + 0x50))
                                               (&aStack_248);
                            uVar27 = local_3ec;
                          }
                          if (ppuStack_238 < local_230) {
                            uVar11 = (uint)*(byte *)ppuStack_238;
                            ppuStack_238 = (unsigned_short **)((long)ppuStack_238 + 1);
                          }
                          else {
                            uVar11 = (**(code **)(aStack_248._M_allocated_capacity + 0x50))
                                               (&aStack_248);
                            uVar27 = local_3ec;
                          }
                          if (ppuStack_238 < local_230) {
                            uVar9 = (uint)*(byte *)ppuStack_238;
                            ppuStack_238 = (unsigned_short **)((long)ppuStack_238 + 1);
                          }
                          else {
                            uVar9 = (**(code **)(aStack_248._M_allocated_capacity + 0x50))
                                              (&aStack_248);
                            uVar27 = local_3ec;
                          }
                          if (ppuStack_238 < local_230) {
                            uVar12 = (uint)*(byte *)ppuStack_238;
                            ppuStack_238 = (unsigned_short **)((long)ppuStack_238 + 1);
                          }
                          else {
                            uVar12 = (**(code **)(aStack_248._M_allocated_capacity + 0x50))
                                               (&aStack_248);
                            uVar27 = local_3ec;
                          }
                          uVar12 = uVar12 << 0x18;
                          uVar10 = (uVar9 & 0xff) << 0x10 | (uVar11 & 0xff) << 8 | uVar10 & 0xff;
                        }
                        else {
                          if (ppuStack_238 < local_230) {
                            uVar11 = (uint)*(byte *)ppuStack_238;
                            ppuStack_238 = (unsigned_short **)((long)ppuStack_238 + 1);
                          }
                          else {
                            uVar11 = (**(code **)(aStack_248._M_allocated_capacity + 0x50))
                                               (&aStack_248);
                            uVar27 = local_3ec;
                          }
                          if (ppuStack_238 < local_230) {
                            uVar9 = (uint)*(byte *)ppuStack_238;
                            ppuStack_238 = (unsigned_short **)((long)ppuStack_238 + 1);
                          }
                          else {
                            uVar9 = (**(code **)(aStack_248._M_allocated_capacity + 0x50))
                                              (&aStack_248);
                            uVar27 = local_3ec;
                          }
                          if (ppuStack_238 < local_230) {
                            uVar12 = (uint)*(byte *)ppuStack_238;
                            ppuStack_238 = (unsigned_short **)((long)ppuStack_238 + 1);
                          }
                          else {
                            uVar12 = (**(code **)(aStack_248._M_allocated_capacity + 0x50))
                                               (&aStack_248);
                            uVar27 = local_3ec;
                          }
                          if (ppuStack_238 < local_230) {
                            uVar10 = (uint)*(byte *)ppuStack_238;
                            ppuStack_238 = (unsigned_short **)((long)ppuStack_238 + 1);
                          }
                          else {
                            uVar10 = (**(code **)(aStack_248._M_allocated_capacity + 0x50))
                                               (&aStack_248);
                            uVar27 = local_3ec;
                          }
                          uVar12 = (uVar12 & 0xff) << 8 | (uVar9 & 0xff) << 0x10 | uVar11 << 0x18;
                          uVar10 = uVar10 & 0xff;
                        }
                        if ((uVar10 | uVar12 & 0x7fffffff) < 0x7f800000) {
                          *(float *)((long)pvVar26 + uVar23 * 4) =
                               (float)(uVar10 | uVar12) + *(float *)((long)pvVar26 + uVar23 * 4);
                          piVar1 = (int *)((long)local_3e8 + uVar23 * 4);
                          *piVar1 = *piVar1 + 1;
                        }
                        uVar23 = uVar23 + 1;
                        lVar19 = local_3a8;
                        uVar20 = local_3b0;
                      } while (local_380 != uVar23);
                    }
                    lVar13 = local_270 + 1;
                  } while ((lVar13 < local_280) && (local_278 + local_270 + 1 < local_3d0));
                  lVar15 = lVar15 + 1;
                  local_3e8 = (void *)((long)local_3e8 + lVar25);
                  pvVar26 = (void *)((long)pvVar26 + lVar25);
                  lVar13 = local_3c0;
                } while (lVar15 != local_3c0);
              }
              uVar23 = local_288 + 1;
            } while ((uVar23 < local_388) && ((long)(uVar22 + local_288 + 1) < (long)local_3d8));
          }
          lVar15 = lVar24;
          lVar16 = local_2b8;
          if (lVar24 < lVar13) {
            do {
              if (local_3d0 <= (long)((local_3b8 + lVar15) * local_388)) break;
              if (0 < (int)local_380) {
                pppfVar3 = local_3e0->img;
                uVar22 = 0;
                do {
                  iVar8 = *(int *)((long)local_390 + uVar22 * 4 + lVar16 * 4);
                  if (0 < iVar8) {
                    pppfVar3[uVar22][lVar21][lVar15] =
                         *(float *)((long)local_3c8 + uVar22 * 4 + lVar16 * 4) / (float)iVar8;
                  }
                  uVar22 = uVar22 + 1;
                } while (local_380 != uVar22);
                lVar16 = lVar16 + uVar22;
              }
              lVar15 = lVar15 + 1;
            } while (lVar15 != lVar13);
          }
          lVar21 = lVar21 + 1;
        } while (lVar21 != local_2b0);
      }
      operator_delete(local_390);
      operator_delete(local_3c8);
    }
    std::ifstream::close();
    std::ifstream::~ifstream(&in);
    return;
  }
  if (maxval < 0x100) {
    _in = (pointer)((ulong)uStack_254 << 0x20);
    aStack_248._M_allocated_capacity = 0;
    aStack_248._8_8_ = 0;
    ppuStack_238 = (unsigned_short **)0x0;
    local_230 = (unsigned_short **)0x0;
    pppuStack_228 = (unsigned_short ***)0x0;
    Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
              ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)&in,0,0,1);
    (*(this->super_BasicImageIO)._vptr_BasicImageIO[6])
              (this,(Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)&in,name,
               (ulong)(uint)ds,local_3b8,local_3a0,w,h);
    Image<float,_gimage::PixelTraits<float>_>::setImageLimited<unsigned_char>
              (local_3e0,(Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)&in);
    Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::~Image
              ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)&in);
    return;
  }
  _in = (pointer)((ulong)uStack_254 << 0x20);
  aStack_248._M_allocated_capacity = 0;
  aStack_248._8_8_ = 0;
  ppuStack_238 = (unsigned_short **)0x0;
  local_230 = (unsigned_short **)0x0;
  pppuStack_228 = (unsigned_short ***)0x0;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::setSize
            ((Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *)&in,0,0,1);
  (*(this->super_BasicImageIO)._vptr_BasicImageIO[7])
            (this,(Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *)&in,name,
             (ulong)(uint)ds,local_3b8,local_3a0,w,h);
  Image<float,_gimage::PixelTraits<float>_>::setImageLimited<unsigned_short>
            (local_3e0,(Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *)&in);
  std::__cxx11::string::string((string *)&s,name,(allocator *)&prop);
  lVar19 = std::__cxx11::string::rfind((char *)&s,0x1643d4,0xffffffffffffffff);
  if (lVar19 == s._M_string_length - 9) {
    std::__cxx11::string::rfind((char *)&s,0x1643d4,0xffffffffffffffff);
    std::__cxx11::string::substr((ulong)&prop,(ulong)&s);
    std::__cxx11::string::operator=((string *)&s,(string *)&prop);
    if ((_Base_ptr *)prop.data._M_t._M_impl._0_8_ ==
        &prop.data._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) goto LAB_0013b6f7;
  }
  else {
    lVar19 = std::__cxx11::string::rfind((char *)&s,0x1643de,0xffffffffffffffff);
    if (lVar19 != s._M_string_length - 0xb) {
      std::__cxx11::string::_M_replace((ulong)&s,0,(char *)s._M_string_length,0x163a42);
      goto LAB_0013b6f7;
    }
    std::__cxx11::string::rfind((char *)&s,0x1643de,0xffffffffffffffff);
    std::__cxx11::string::substr((ulong)&prop,(ulong)&s);
    std::__cxx11::string::operator=((string *)&s,(string *)&prop);
    if ((_Base_ptr *)prop.data._M_t._M_impl._0_8_ ==
        &prop.data._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) goto LAB_0013b6f7;
  }
  operator_delete((void *)prop.data._M_t._M_impl._0_8_);
LAB_0013b6f7:
  if (s._M_string_length != 0) {
    prop.data._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &prop.data._M_t._M_impl.super__Rb_tree_header._M_header;
    prop.data._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    prop.data._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    prop.data._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    lVar21 = -1;
    prop.data._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         prop.data._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    lVar19 = std::__cxx11::string::rfind((char)&s,0x5f);
    if (lVar19 != -1) {
      lVar21 = std::__cxx11::string::rfind((char)&s,0x5f);
    }
    if (lVar21 != -1) {
      std::__cxx11::string::substr((ulong)local_50,(ulong)&s);
      plVar14 = (long *)std::__cxx11::string::append((char *)local_50);
      plVar17 = plVar14 + 2;
      if ((long *)*plVar14 == plVar17) {
        local_368 = *plVar17;
        lStack_360 = plVar14[3];
        _subbit = &local_368;
      }
      else {
        local_368 = *plVar17;
        _subbit = (long *)*plVar14;
      }
      local_370 = plVar14[1];
      *plVar14 = (long)plVar17;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      gutil::Properties::load(&prop,(char *)_subbit);
      if (_subbit != &local_368) {
        operator_delete(_subbit);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    _subbit = &local_368;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&subbit,s._M_dataplus._M_p,s._M_dataplus._M_p + s._M_string_length);
    std::__cxx11::string::append((char *)&subbit);
    gutil::Properties::load(&prop,(char *)_subbit);
    if (_subbit != &local_368) {
      operator_delete(_subbit);
    }
    bVar7 = gutil::Properties::contains(&prop,"subbit");
    if (bVar7) {
      lVar19 = local_3e0->height;
      if (0 < lVar19) {
        lVar21 = local_3e0->width;
        pppfVar3 = local_3e0->img;
        lVar24 = 0;
        do {
          if (0 < lVar21) {
            pfVar2 = (*pppfVar3)[lVar24];
            lVar25 = 0;
            do {
              if (32767.0 < pfVar2[lVar25]) {
                pfVar2[lVar25] = INFINITY;
              }
              lVar25 = lVar25 + 1;
            } while (lVar21 != lVar25);
          }
          lVar24 = lVar24 + 1;
        } while (lVar24 != lVar19);
      }
      gutil::Properties::getValue<int>(&prop,"subbit",&subbit,(char *)0x0);
      if (0 < subbit) {
        operator/=(local_3e0,(double)(1 << ((byte)_subbit & 0x1f)));
      }
    }
    bVar7 = gutil::Properties::contains(&prop,"origin.d");
    if (bVar7) {
      gutil::Properties::getValue<double>(&prop,"origin.d",(double *)&subbit,(char *)0x0);
      if (((double)_subbit != 0.0) || (NAN((double)_subbit))) {
        operator+=(local_3e0,(float)(double)_subbit);
      }
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&prop);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)s._M_dataplus._M_p != &s.field_2) {
    operator_delete(s._M_dataplus._M_p);
  }
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::~Image
            ((Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *)&in);
  return;
}

Assistant:

void PNMImageIO::load(ImageFloat &image, const char *name, int ds, long x,
                      long y, long w, long h) const
{
  long  width, height, maxval;
  float scale;
  int   depth;
  std::istream::pos_type pos;
  float p;
  char *c=reinterpret_cast<char *>(&p);
  bool msbfirst=gutil::isMSBFirst();

  if (!handlesFile(name, true))
  {
    throw gutil::IOException("Can only load PNM image ("+std::string(name)+")");
  }

  pos=readPNMHeader(name, depth, maxval, scale, width, height);

  if (scale != 0)
  {
    ds=std::max(1, ds);

    if (w < 0)
    {
      w=(width+ds-1)/ds;
    }

    if (h < 0)
    {
      h=(height+ds-1)/ds;
    }

    image.setSize(w, h, depth);
    image.clear();

    try
    {
      std::ifstream in;
      in.exceptions(std::ios_base::failbit | std::ios_base::badbit | std::ios_base::eofbit);
      in.open(name, std::ios::binary);

      // load downscaled part?

      if (ds > 1 || x != 0 || y != 0 || w != width || h != height)
      {
        std::valarray<float> vline(0.0f, w*depth);
        std::valarray<int> nline(0, w*depth);

        for (long k=std::max(0l, -y); k<h && (y+k)*ds<height; k++)
        {
          // load downscaled line

          vline=0;
          nline=0;

          for (long kk=0; kk<ds && kk+(y+k)*ds<height; kk++)
          {
            in.seekg(pos+static_cast<std::streamoff>(height-1-(y+k)*ds-kk)*width*depth*4+
                     static_cast<std::streamoff>(std::max(0l, x))*ds*depth*4);

            std::streambuf *sb=in.rdbuf();

            long j=std::max(0l, -x)*depth;

            for (long i=std::max(0l, -x); i<w && (x+i)*ds<width; i++)
            {
              for (int ii=0; ii<ds && (x+i)*ds+ii<width; ii++)
              {
                for (int d=0; d<depth; d++)
                {
                  // we assume that the plattform uses IEEE 32 bit floating
                  // point format, otherwise this will not work

                  if ((scale > 0 && msbfirst) || (scale < 0 && !msbfirst))
                  {
                    c[0]=sb->sbumpc();
                    c[1]=sb->sbumpc();
                    c[2]=sb->sbumpc();
                    c[3]=sb->sbumpc();
                  }
                  else
                  {
                    c[3]=sb->sbumpc();
                    c[2]=sb->sbumpc();
                    c[1]=sb->sbumpc();
                    c[0]=sb->sbumpc();
                  }

                  if (image.isValidS(p))
                  {
                    vline[j+d]+=p;
                    nline[j+d]++;
                  }
                }
              }

              j+=depth;
            }
          }

          // store line into image

          long j=std::max(0l, -x)*depth;

          for (long i=std::max(0l, -x); i<w && (x+i)*ds<width; i++)
          {
            for (int d=0; d<depth; d++)
            {
              if (nline[j] > 0)
              {
                image.set(i, k, d, vline[j]/nline[j]);
              }

              j++;
            }
          }
        }
      }
      else // load whole image
      {
        in.seekg(pos);
        std::streambuf *sb=in.rdbuf();

        for (long k=height-1; k>=0; k--)
        {
          for (long i=0; i<width; i++)
          {
            for (int d=0; d<depth; d++)
            {
              // we assume that the plattform uses IEEE 32 bit floating
              // point format, otherwise this will not work

              if ((scale > 0 && msbfirst) || (scale < 0 && !msbfirst))
              {
                c[0]=sb->sbumpc();
                c[1]=sb->sbumpc();
                c[2]=sb->sbumpc();
                c[3]=sb->sbumpc();
              }
              else
              {
                c[3]=sb->sbumpc();
                c[2]=sb->sbumpc();
                c[1]=sb->sbumpc();
                c[0]=sb->sbumpc();
              }

              image.set(i, k, d, p);
            }
          }
        }
      }

      in.close();
    }
    catch (const std::ios_base::failure &ex)
    {
      throw gutil::IOException(ex.what());
    }
  }
  else if (maxval > 255)
  {
    ImageU16 imageu16;
    load(imageu16, name, ds, x, y, w, h);
    image.setImageLimited(imageu16);

    // support for reading legacy disparity images in fixed point format

    std::string s=name;

    if (s.rfind("_disp.pgm") == s.size()-9)
    {
      s=s.substr(0, s.rfind("_disp.pgm"));
    }
    else if (s.rfind("_height.pgm") == s.size()-11)
    {
      s=s.substr(0, s.rfind("_height.pgm"));
    }
    else
    {
      s="";
    }

    if (s.size() > 0)
    {
      gutil::Properties prop;

      try
      {
        size_t pos=s.rfind('_');

        if (pos != s.npos)
        {
          pos=s.rfind('_', pos-1);
        }

        if (pos != s.npos)
        {
          prop.load((s.substr(0, pos)+"_param.txt").c_str());
        }
      }
      catch (const std::exception &)
      { }

      try
      {
        prop.load((s+"_param.txt").c_str());
      }
      catch (const std::exception &)
      { }

      if (prop.contains("subbit"))
      {
        // invalid disparities in legacy disparity images have a value > 32767

        for (long k=0; k<image.getHeight(); k++)
        {
          for (long i=0; i<image.getWidth(); i++)
          {
            if (image.get(i, k) > 32767)
            {
              image.setInvalid(i, k, 0);
            }
          }
        }

        // consider sub-pixel setting

        int subbit;
        prop.getValue("subbit", subbit);

        if (subbit > 0)
        {
          image/=1<<subbit;
        }
      }

      // consider offset

      if (prop.contains("origin.d"))
      {
        double offset;
        prop.getValue("origin.d", offset);

        if (offset != 0)
        {
          image+=static_cast<float>(offset);
        }
      }
    }
  }
  else
  {
    ImageU8 imageu8;
    load(imageu8, name, ds, x, y, w, h);
    image.setImageLimited(imageu8);
  }
}